

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void I422ToAR30Row_AVX2(uint8_t *y_buf,uint8_t *u_buf,uint8_t *v_buf,uint8_t *dst_ar30,
                       YuvConstants *yuvconstants,int width)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  bool bVar10;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM7 [64];
  int width_local;
  
  auVar3 = *(undefined1 (*) [32])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [32])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [32])yuvconstants->kUVToR;
  auVar6 = *(undefined1 (*) [32])yuvconstants->kUVBiasB;
  auVar7 = *(undefined1 (*) [32])yuvconstants->kUVBiasG;
  auVar8 = *(undefined1 (*) [32])yuvconstants->kUVBiasR;
  auVar9 = *(undefined1 (*) [32])yuvconstants->kYToRgb;
  lVar11 = (long)v_buf - (long)u_buf;
  auVar18 = vpcmpeqb_avx2(in_ZMM5._0_32_,in_ZMM5._0_32_);
  auVar18 = vpsrlw_avx2(auVar18,0xe);
  auVar19 = vpsllw_avx2(auVar18,4);
  auVar18 = vpcmpeqb_avx2(in_ZMM7._0_32_,in_ZMM7._0_32_);
  auVar18 = vpsrlw_avx2(auVar18,6);
  do {
    uVar2 = *(ulong *)u_buf;
    puVar1 = (ulong *)((long)u_buf + lVar11);
    u_buf = (uint8_t *)((long)u_buf + 8);
    auVar13 = vpunpcklbw_avx2(ZEXT832(uVar2),ZEXT832(*puVar1));
    auVar13 = vpermq_avx2(auVar13,0xd8);
    auVar16 = vpunpcklwd_avx2(auVar13,auVar13);
    auVar13 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])y_buf),0xd8);
    auVar17 = vpunpcklbw_avx2(auVar13,auVar13);
    y_buf = (uint8_t *)((long)y_buf + 0x10);
    auVar13 = vpmaddubsw_avx2(auVar16,auVar5);
    auVar14 = vpmaddubsw_avx2(auVar16,auVar4);
    auVar16 = vpmaddubsw_avx2(auVar16,auVar3);
    auVar15 = vpsubw_avx2(auVar8,auVar13);
    auVar14 = vpsubw_avx2(auVar7,auVar14);
    auVar13 = vpsubw_avx2(auVar6,auVar16);
    auVar16 = vpmulhuw_avx2(auVar9,auVar17);
    auVar13 = vpaddsw_avx2(auVar13,auVar16);
    auVar14 = vpaddsw_avx2(auVar14,auVar16);
    auVar16 = vpaddsw_avx2(auVar15,auVar16);
    auVar13 = vpsraw_avx2(auVar13,4);
    auVar14 = vpsraw_avx2(auVar14,4);
    auVar16 = vpsraw_avx2(auVar16,4);
    auVar13 = vpminsw_avx2(auVar13,auVar18);
    auVar14 = vpminsw_avx2(auVar14,auVar18);
    auVar16 = vpminsw_avx2(auVar16,auVar18);
    auVar13 = vpmaxsw_avx2(auVar13,(undefined1  [32])0x0);
    auVar14 = vpmaxsw_avx2(auVar14,(undefined1  [32])0x0);
    auVar16 = vpmaxsw_avx2(auVar16,(undefined1  [32])0x0);
    auVar16 = vpsllw_avx2(auVar16,4);
    auVar13 = vpermq_avx2(auVar13,0xd8);
    auVar15 = vpermq_avx2(auVar14,0xd8);
    auVar16 = vpermq_avx2(auVar16,0xd8);
    auVar14 = vpunpckhwd_avx2(auVar13,auVar16);
    auVar16 = vpunpcklwd_avx2(auVar13,auVar16);
    auVar13 = vpunpckhwd_avx2(auVar15,auVar19);
    auVar15 = vpunpcklwd_avx2(auVar15,auVar19);
    auVar15 = vpslld_avx2(auVar15,10);
    auVar17 = vpslld_avx2(auVar13,10);
    auVar13 = vpor_avx2(auVar16,auVar15);
    auVar14 = vpor_avx2(auVar14,auVar17);
    *(undefined1 (*) [32])dst_ar30 = auVar13;
    *(undefined1 (*) [32])((long)dst_ar30 + 0x20) = auVar14;
    dst_ar30 = (uint8_t *)((long)dst_ar30 + 0x40);
    iVar12 = width + -0x10;
    bVar10 = 0xf < width;
    width = iVar12;
  } while (iVar12 != 0 && bVar10);
  return;
}

Assistant:

void OMITFP I422ToAR30Row_AVX2(const uint8_t* y_buf,
                               const uint8_t* u_buf,
                               const uint8_t* v_buf,
                               uint8_t* dst_ar30,
                               const struct YuvConstants* yuvconstants,
                               int width) {
  asm volatile (
    YUVTORGB_SETUP_AVX2(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "vpcmpeqb    %%ymm5,%%ymm5,%%ymm5          \n"  // AR30 constants
      "vpsrlw      $14,%%ymm5,%%ymm5             \n"
      "vpsllw      $4,%%ymm5,%%ymm5              \n"  // 2 alpha bits
      "vpxor       %%ymm6,%%ymm6,%%ymm6          \n"  // 0 for min
      "vpcmpeqb    %%ymm7,%%ymm7,%%ymm7          \n"  // 1023 for max
      "vpsrlw      $6,%%ymm7,%%ymm7              \n"

    LABELALIGN
      "1:                                        \n"
    READYUV422_AVX2
    YUVTORGB16_AVX2(yuvconstants)
    STOREAR30_AVX2
      "sub         $0x10,%[width]                \n"
      "jg          1b                            \n"

      "vzeroupper                                \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_ar30]"+r"(dst_ar30),  // %[dst_ar30]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS_AVX2
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6", "xmm7"
  );
}